

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O2

QDataStream * operator>>(QDataStream *stream,QEasingCurveFunction *func)

{
  if (func != (QEasingCurveFunction *)0x0) {
    QDataStream::operator>>(stream,&func->_p);
    QDataStream::operator>>(stream,&func->_a);
    QDataStream::operator>>(stream,&func->_o);
    if (0x12 < stream->ver) {
      QtPrivate::readArrayBasedContainer<QList<QPointF>>(stream,&func->_bezierCurves);
      QtPrivate::readArrayBasedContainer<QList<TCBPoint>>(stream,&func->_tcbPoints);
    }
  }
  return stream;
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QEasingCurveFunction *func)
{
    if (func) {
        stream >> func->_p;
        stream >> func->_a;
        stream >> func->_o;
        if (stream.version() > QDataStream::Qt_5_12) {
            stream >> func->_bezierCurves;
            stream >> func->_tcbPoints;
        }
    }
    return stream;
}